

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

repcodes_t ZSTD_newRep(U32 *rep,U32 offBase,U32 ll0)

{
  repcodes_t rVar1;
  U32 ll0_local;
  U32 offBase_local;
  U32 *rep_local;
  repcodes_t newReps;
  U32 UVar2;
  
  newReps.rep[0] = rep[2];
  rep_local = *(U32 **)rep;
  ZSTD_updateRep((U32 *)&rep_local,offBase,ll0);
  rVar1.rep[0] = (U32)rep_local;
  rVar1.rep[1] = (U32)((ulong)rep_local >> 0x20);
  register0x00000010 = newReps.rep[0];
  return (repcodes_t)rVar1.rep;
}

Assistant:

MEM_STATIC repcodes_t
ZSTD_newRep(U32 const rep[ZSTD_REP_NUM], U32 const offBase, U32 const ll0)
{
    repcodes_t newReps;
    ZSTD_memcpy(&newReps, rep, sizeof(newReps));
    ZSTD_updateRep(newReps.rep, offBase, ll0);
    return newReps;
}